

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O1

void __thiscall itis::SplayTree::insert(SplayTree *this,int x)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar2 = this->root;
  if (this->root == (Node *)0x0) {
    pNVar2 = (Node *)operator_new(0x20);
    pNVar2->data = x;
    pNVar2->parent = (Node *)0x0;
    pNVar2->left_child = (Node *)0x0;
    pNVar2->right_child = (Node *)0x0;
  }
  else {
    do {
      while (pNVar1 = pNVar2, x < pNVar1->data) {
        pNVar2 = pNVar1->left_child;
        if (pNVar1->left_child == (Node *)0x0) {
          pNVar2 = (Node *)operator_new(0x20);
          pNVar2->data = x;
          pNVar2->parent = (Node *)0x0;
          pNVar2->left_child = (Node *)0x0;
          pNVar2->right_child = (Node *)0x0;
          pNVar1->left_child = pNVar2;
          goto LAB_001044bf;
        }
      }
      pNVar2 = pNVar1->right_child;
    } while (pNVar1->right_child != (Node *)0x0);
    pNVar2 = (Node *)operator_new(0x20);
    pNVar2->data = x;
    pNVar2->parent = (Node *)0x0;
    pNVar2->left_child = (Node *)0x0;
    pNVar2->right_child = (Node *)0x0;
    pNVar1->right_child = pNVar2;
LAB_001044bf:
    pNVar2->parent = pNVar1;
    splay(this,pNVar2);
  }
  this->root = pNVar2;
  return;
}

Assistant:

void SplayTree::insert(int x) {
    if (root == nullptr) {
      root = new Node(x);
      return;
    }
    Node *curr = this->root;
    while (curr != nullptr) {
      if (x < curr->data) {
        if (curr->left_child == nullptr) {
          Node *new_node = new Node(x);
          curr->left_child = new_node;
          new_node->parent = curr;
          splay(new_node);
          this->root = new_node;
          return;
        } else {
          curr = curr->left_child;
        }
      } else if (x >= curr->data) {
        if (curr->right_child == nullptr) {
          Node *new_node = new Node(x);
          curr->right_child = new_node;
          new_node->parent = curr;
          splay(new_node);
          this->root = new_node;
          return;
        } else {
          curr = curr->right_child;
        }
      } else {
        splay(curr);
        return;
      }
    }
  }